

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O2

Type * parse_abstract_declarator
                 (Translation_Data *translation_data,Scope *scope,Denotation_Prototype *prototype)

{
  Type *extraout_RAX;
  Denoted_Base *base;
  
  get_denoted_base(prototype);
  parse_declarator_inner(translation_data,scope,base);
  return extraout_RAX;
}

Assistant:

struct Type* parse_abstract_declarator(struct Translation_Data *translation_data,struct Scope *scope,struct Denotation_Prototype *prototype)
{
	struct Denoted_Base *base;
	struct Type *ret;


	get_denoted_base(prototype);
	parse_declarator_inner(translation_data,scope,base);

	if(base->denotation==DT_Error || base->id!=NULL)
	{
		/*TODO error*/
		push_translation_error("unexpedted id in abstract declarator",translation_data);
		delete_denoted_prototype(prototype);
		ret=base->type;
		delete_denoted_base(base);
		return ret;
	}
	delete_denoted_prototype(prototype);
	ret=base->type;
	delete_denoted_base(base);
	return ret;

}